

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pillar.cpp
# Opt level: O1

void __thiscall DPillar::Tick(DPillar *this)

{
  double dest;
  double dest_00;
  sector_t_conflict *this_00;
  EMoveResult EVar1;
  EMoveResult EVar2;
  bool bVar3;
  
  this_00 = (this->super_DMover).super_DSectorEffect.m_Sector;
  dest = (this_00->floorplane).D;
  dest_00 = (this_00->ceilingplane).D;
  bVar3 = this->m_Type != pillarBuild;
  EVar1 = sector_t::MoveFloor((sector_t *)this_00,this->m_FloorSpeed,this->m_FloorTarget,
                              this->m_Crush,-(uint)bVar3 | 1,this->m_Hexencrush);
  EVar2 = sector_t::MoveCeiling
                    ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                     this->m_CeilingSpeed,this->m_CeilingTarget,this->m_Crush,(uint)bVar3 * 2 + -1,
                     this->m_Hexencrush);
  if ((EVar2 == pastdest) && (EVar1 == pastdest)) {
    SN_StopSequence((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,1);
    (*(this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])(this);
    return;
  }
  if (EVar1 == crushed) {
    sector_t::MoveFloor((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,
                        this->m_FloorSpeed,dest,-1,-1,this->m_Hexencrush);
  }
  if (EVar2 == crushed) {
    sector_t::MoveCeiling
              ((sector_t *)(this->super_DMover).super_DSectorEffect.m_Sector,this->m_CeilingSpeed,
               dest_00,-1,1,this->m_Hexencrush);
    return;
  }
  return;
}

Assistant:

void DPillar::Tick ()
{
	EMoveResult r, s;
	double oldfloor, oldceiling;

	oldfloor = m_Sector->floorplane.fD();
	oldceiling = m_Sector->ceilingplane.fD();

	if (m_Type == pillarBuild)
	{
		r = m_Sector->MoveFloor (m_FloorSpeed, m_FloorTarget, m_Crush, 1, m_Hexencrush);
		s = m_Sector->MoveCeiling (m_CeilingSpeed, m_CeilingTarget, m_Crush, -1, m_Hexencrush);
	}
	else
	{
		r = m_Sector->MoveFloor (m_FloorSpeed, m_FloorTarget, m_Crush, -1, m_Hexencrush);
		s = m_Sector->MoveCeiling (m_CeilingSpeed, m_CeilingTarget, m_Crush, 1, m_Hexencrush);
	}

	if (r == EMoveResult::pastdest && s == EMoveResult::pastdest)
	{
		SN_StopSequence (m_Sector, CHAN_FLOOR);
		Destroy ();
	}
	else
	{
		if (r == EMoveResult::crushed)
		{
			m_Sector->MoveFloor (m_FloorSpeed, oldfloor, -1, -1, m_Hexencrush);
		}
		if (s == EMoveResult::crushed)
		{
			m_Sector->MoveCeiling (m_CeilingSpeed, oldceiling, -1, 1, m_Hexencrush);
		}
	}
}